

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  uint uVar1;
  uint uVar2;
  CompilerError *pCVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  uint local_58;
  uint local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = *(uint *)&(out_type->super_IVariant).field_0xc;
  uVar5 = uVar1 ^ 8;
  uVar2 = *(uint *)&(in_type->super_IVariant).field_0xc;
  if (uVar5 != 0 || (uVar2 ^ 7) != 0) {
    if ((uVar1 ^ 10) != 0 || (uVar2 ^ 9) != 0) {
      if (uVar5 == 0 && (uVar2 ^ 0xd) == 0) {
        pcVar4 = "asuint";
        goto LAB_002c6593;
      }
      uVar6 = uVar2 ^ 8;
      if ((uVar1 ^ 7) != 0 || uVar6 != 0) {
        local_54 = uVar1 ^ 9;
        local_58 = uVar2 ^ 10;
        if (local_54 != 0 || local_58 != 0) {
          if ((uVar1 ^ 7) == 0 && (uVar2 ^ 0xd) == 0) {
            pcVar4 = "asint";
          }
          else if (((uVar1 ^ 0xd) == 0 && uVar6 == 0) || ((uVar1 ^ 0xd) == 0 && (uVar2 ^ 7) == 0)) {
            pcVar4 = "asfloat";
          }
          else {
            local_54 = local_54 | uVar2 ^ 0xe;
            if (local_54 == 0) {
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&bStack_78,"Double to Int64 is not supported in HLSL.",
                         (allocator *)&local_50);
              CompilerError::CompilerError(pCVar3,&bStack_78);
              __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((uVar1 ^ 10) == 0 && (uVar2 ^ 0xe) == 0) {
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&bStack_78,"Double to UInt64 is not supported in HLSL.",
                         (allocator *)&local_50);
              CompilerError::CompilerError(pCVar3,&bStack_78);
              __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (((uVar2 ^ 9) == 0 && (uVar1 ^ 0xe) == 0) || ((uVar1 ^ 0xe) == 0 && local_58 == 0)) {
              pcVar4 = "asdouble";
            }
            else if (in_type->vecsize == 1 && (uVar6 == 0 && (uVar1 ^ 0xc) == 0)) {
              if (this->requires_explicit_fp16_packing == false) {
                this->requires_explicit_fp16_packing = true;
                Compiler::force_recompile((Compiler *)this);
              }
              pcVar4 = "spvUnpackFloat2x16";
            }
            else {
              if (in_type->vecsize != 2 || (uVar5 != 0 || (uVar2 ^ 0xc) != 0)) {
                if (uVar1 == 6 && (uVar2 ^ 0xc) == 0) {
                  if ((this->hlsl_options).shader_model < 0x28) {
                    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&bStack_78,"Half to UShort requires Shader Model 4.",
                               (allocator *)&local_50);
                    CompilerError::CompilerError(pCVar3,&bStack_78);
                    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error
                               );
                  }
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_50,this,out_type,0);
                  ::std::operator+(&bStack_78,"(",&local_50);
                  ::std::operator+(__return_storage_ptr__,&bStack_78,")f32tof16");
                }
                else {
                  if ((uVar1 ^ 0xc) != 0 || uVar2 != 6) {
                    pcVar4 = "";
                    goto LAB_002c6593;
                  }
                  if ((this->hlsl_options).shader_model < 0x28) {
                    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&bStack_78,"UShort to Half requires Shader Model 4.",
                               (allocator *)&local_50);
                    CompilerError::CompilerError(pCVar3,&bStack_78);
                    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error
                               );
                  }
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_50,this,out_type,0);
                  ::std::operator+(&bStack_78,"(",&local_50);
                  ::std::operator+(__return_storage_ptr__,&bStack_78,")f16tof32");
                }
                ::std::__cxx11::string::~string((string *)&bStack_78);
                ::std::__cxx11::string::~string((string *)&local_50);
                return __return_storage_ptr__;
              }
              if (this->requires_explicit_fp16_packing == false) {
                this->requires_explicit_fp16_packing = true;
                Compiler::force_recompile((Compiler *)this);
              }
              pcVar4 = "spvPackFloat2x16";
            }
          }
LAB_002c6593:
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,pcVar4,(allocator *)&bStack_78);
          return __return_storage_ptr__;
        }
      }
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (__return_storage_ptr__,this,out_type,0);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvUnpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvPackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("Half to UShort requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f32tof16";
	}
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("UShort to Half requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f16tof32";
	}
	else
		return "";
}